

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_bounding_box_diagonal(REF_NODE ref_node,REF_DBL *diagonal)

{
  REF_MPI ref_mpi_00;
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_DBL local_98;
  REF_DBL local_90;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_INT node;
  REF_DBL temp;
  REF_DBL max_xyz [3];
  double local_48;
  REF_DBL min_xyz [3];
  REF_MPI ref_mpi;
  REF_DBL *diagonal_local;
  REF_NODE ref_node_local;
  
  ref_mpi_00 = ref_node->ref_mpi;
  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
    min_xyz[(long)ref_private_macro_code_rss_1 + -1] = 1e+200;
    max_xyz[(long)ref_private_macro_code_rss_1 + -1] = -1e+200;
  }
  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_node->max;
      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
    if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < ref_node->max)) &&
       (-1 < ref_node->global[ref_private_macro_code_rss])) {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        if (ref_node->real[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 0xf] <=
            min_xyz[(long)ref_private_macro_code_rss_1 + -1]) {
          local_90 = ref_node->real[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 0xf]
          ;
        }
        else {
          local_90 = min_xyz[(long)ref_private_macro_code_rss_1 + -1];
        }
        min_xyz[(long)ref_private_macro_code_rss_1 + -1] = local_90;
        if (max_xyz[(long)ref_private_macro_code_rss_1 + -1] <
            ref_node->real[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 0xf] ||
            max_xyz[(long)ref_private_macro_code_rss_1 + -1] ==
            ref_node->real[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 0xf]) {
          local_98 = ref_node->real[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 0xf]
          ;
        }
        else {
          local_98 = max_xyz[(long)ref_private_macro_code_rss_1 + -1];
        }
        max_xyz[(long)ref_private_macro_code_rss_1 + -1] = local_98;
      }
    }
  }
  ref_private_macro_code_rss_1 = 0;
  while( true ) {
    if (2 < ref_private_macro_code_rss_1) {
      if (ref_mpi_00->id == 0) {
        dVar2 = pow(temp - local_48,2.0);
        dVar3 = pow(max_xyz[0] - min_xyz[0],2.0);
        dVar4 = pow(max_xyz[1] - min_xyz[1],2.0);
        dVar2 = sqrt(dVar2 + dVar3 + dVar4);
        *diagonal = dVar2;
      }
      ref_node_local._4_4_ = ref_mpi_bcast(ref_mpi_00,diagonal,1,3);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xd2f,"ref_node_bounding_box_diagonal",(ulong)ref_node_local._4_4_,"bcast");
      }
      return ref_node_local._4_4_;
    }
    _i = min_xyz[(long)ref_private_macro_code_rss_1 + -1];
    uVar1 = ref_mpi_min(ref_mpi_00,&i,min_xyz + (long)ref_private_macro_code_rss_1 + -1,3);
    if (uVar1 != 0) break;
    _i = max_xyz[(long)ref_private_macro_code_rss_1 + -1];
    uVar1 = ref_mpi_max(ref_mpi_00,&i,max_xyz + (long)ref_private_macro_code_rss_1 + -1,3);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xd28,
             "ref_node_bounding_box_diagonal",(ulong)uVar1,"mpi max");
      return uVar1;
    }
    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xd26,
         "ref_node_bounding_box_diagonal",(ulong)uVar1,"mpi min");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_box_diagonal(REF_NODE ref_node,
                                                  REF_DBL *diagonal) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_DBL min_xyz[3], max_xyz[3], temp;
  REF_INT node, i;
  for (i = 0; i < 3; i++) {
    min_xyz[i] = REF_DBL_MAX;
    max_xyz[i] = REF_DBL_MIN;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 3; i++) {
      min_xyz[i] = MIN(min_xyz[i], ref_node_xyz(ref_node, i, node));
      max_xyz[i] = MAX(max_xyz[i], ref_node_xyz(ref_node, i, node));
    }
  }
  for (i = 0; i < 3; i++) {
    temp = min_xyz[i];
    RSS(ref_mpi_min(ref_mpi, &temp, &(min_xyz[i]), REF_DBL_TYPE), "mpi min");
    temp = max_xyz[i];
    RSS(ref_mpi_max(ref_mpi, &temp, &(max_xyz[i]), REF_DBL_TYPE), "mpi max");
  }
  if (ref_mpi_once(ref_mpi)) {
    *diagonal =
        sqrt(pow(max_xyz[0] - min_xyz[0], 2) + pow(max_xyz[1] - min_xyz[1], 2) +
             pow(max_xyz[2] - min_xyz[2], 2));
  }
  RSS(ref_mpi_bcast(ref_mpi, diagonal, 1, REF_DBL_TYPE), "bcast");
  return REF_SUCCESS;
}